

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_round_box.cxx
# Opt level: O0

void fl_round_down_box(int x,int y,int w,int h,Fl_Color bgcolor)

{
  Fl_Color color;
  uchar *puVar1;
  uchar *g;
  Fl_Color bgcolor_local;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  
  puVar1 = fl_gray_ramp();
  color = Fl::box_color(bgcolor);
  draw(3,x,y,w,h,2,color);
  draw(0,x + 1,y,w + -2,h,0,(uint)puVar1[0x4e]);
  draw(0,x + 1,y,w + -2,h,1,(uint)puVar1[0x48]);
  draw(0,x,y,w,h,0,(uint)puVar1[0x4e]);
  draw(0,x,y,w,h,1,(uint)puVar1[0x48]);
  draw(1,x,y,w,h,0,(uint)puVar1[0x53]);
  draw(1,x + 1,y,w + -2,h,0,(uint)puVar1[0x55]);
  draw(1,x,y,w,h,1,(uint)puVar1[0x55]);
  draw(1,x + 1,y,w + -2,h,1,(uint)puVar1[0x57]);
  draw(2,x,y,w,h,2,(uint)puVar1[0x41]);
  return;
}

Assistant:

void fl_round_down_box(int x, int y, int w, int h, Fl_Color bgcolor) {
  const uchar *g = fl_gray_ramp();
  draw(FILL,	    x,   y, w,   h, 2, Fl::box_color(bgcolor));
  draw(UPPER_LEFT,  x+1, y, w-2, h, 0, (Fl_Color)g[(int)'N']);
  draw(UPPER_LEFT,  x+1, y, w-2, h, 1, (Fl_Color)g[(int)'H']);
  draw(UPPER_LEFT,  x,   y, w,   h, 0, (Fl_Color)g[(int)'N']);
  draw(UPPER_LEFT,  x,   y, w,   h, 1, (Fl_Color)g[(int)'H']);
  draw(LOWER_RIGHT, x,   y, w,   h, 0, (Fl_Color)g[(int)'S']);
  draw(LOWER_RIGHT, x+1, y, w-2, h, 0, (Fl_Color)g[(int)'U']);
  draw(LOWER_RIGHT, x,   y, w,   h, 1, (Fl_Color)g[(int)'U']);
  draw(LOWER_RIGHT, x+1, y, w-2, h, 1, (Fl_Color)g[(int)'W']);
  draw(CLOSED,	    x,   y, w,   h, 2, (Fl_Color)g[(int)'A']);
}